

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O0

void CoreML::Specification::CoreMLModels::protobuf_SoundAnalysisPreprocessing_2eproto::TableStruct::
     Shutdown(void)

{
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish>
            *)_SoundAnalysisPreprocessing_Vggish_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing>
              *)_SoundAnalysisPreprocessing_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _SoundAnalysisPreprocessing_Vggish_default_instance_.Shutdown();
  _SoundAnalysisPreprocessing_default_instance_.Shutdown();
}